

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O3

void duckdb::ArgMaxFun::GetFunctions(void)

{
  undefined8 *puVar1;
  AggregateFunctionSet *in_RDI;
  undefined8 *puVar2;
  LogicalType *by_type;
  LogicalType *by_type_00;
  long lVar3;
  byte bVar4;
  initializer_list<duckdb::LogicalType> __l;
  vector<duckdb::LogicalType,_true> by_types;
  allocator_type local_2c9;
  LogicalType local_2c8 [24];
  LogicalType local_2b0 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_298;
  undefined1 local_280 [144];
  LogicalType aLStack_1f0 [32];
  undefined8 auStack_1d0 [14];
  element_type *local_160;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_158;
  undefined1 local_150 [48];
  LogicalType local_120 [96];
  LogicalType local_c0 [32];
  undefined8 auStack_a0 [14];
  element_type *local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  bVar4 = 0;
  duckdb::AggregateFunctionSet::AggregateFunctionSet(in_RDI);
  duckdb::LogicalType::LogicalType((LogicalType *)local_280,INTEGER);
  AddArgMinMaxFunctionBy<duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>,int>
            (in_RDI,(LogicalType *)local_280);
  duckdb::LogicalType::~LogicalType((LogicalType *)local_280);
  duckdb::LogicalType::LogicalType((LogicalType *)local_280,BIGINT);
  AddArgMinMaxFunctionBy<duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>,long>
            (in_RDI,(LogicalType *)local_280);
  duckdb::LogicalType::~LogicalType((LogicalType *)local_280);
  duckdb::LogicalType::LogicalType((LogicalType *)local_280,DOUBLE);
  AddArgMinMaxFunctionBy<duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>,double>
            (in_RDI,(LogicalType *)local_280);
  duckdb::LogicalType::~LogicalType((LogicalType *)local_280);
  duckdb::LogicalType::LogicalType((LogicalType *)local_280,VARCHAR);
  AddArgMinMaxFunctionBy<duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>,duckdb::string_t>
            (in_RDI,(LogicalType *)local_280);
  duckdb::LogicalType::~LogicalType((LogicalType *)local_280);
  duckdb::LogicalType::LogicalType((LogicalType *)local_280,DATE);
  AddArgMinMaxFunctionBy<duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>,duckdb::date_t>
            (in_RDI,(LogicalType *)local_280);
  duckdb::LogicalType::~LogicalType((LogicalType *)local_280);
  duckdb::LogicalType::LogicalType((LogicalType *)local_280,TIMESTAMP);
  AddArgMinMaxFunctionBy<duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>,duckdb::timestamp_t>
            (in_RDI,(LogicalType *)local_280);
  duckdb::LogicalType::~LogicalType((LogicalType *)local_280);
  duckdb::LogicalType::LogicalType((LogicalType *)local_280,TIMESTAMP_TZ);
  AddArgMinMaxFunctionBy<duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>,duckdb::timestamp_t>
            (in_RDI,(LogicalType *)local_280);
  duckdb::LogicalType::~LogicalType((LogicalType *)local_280);
  duckdb::LogicalType::LogicalType((LogicalType *)local_280,BLOB);
  AddArgMinMaxFunctionBy<duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>,duckdb::string_t>
            (in_RDI,(LogicalType *)local_280);
  duckdb::LogicalType::~LogicalType((LogicalType *)local_280);
  ArgMaxByTypes();
  for (by_type_00 = (LogicalType *)local_280._0_8_; by_type_00 != (LogicalType *)local_280._8_8_;
      by_type_00 = by_type_00 + 0x18) {
    AddDecimalArgMinMaxFunctionBy<duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>>
              (in_RDI,by_type_00);
  }
  duckdb::LogicalType::LogicalType((LogicalType *)local_150,ANY);
  AddVectorArgMinMaxFunctionBy<duckdb::VectorArgMinMaxBase<duckdb::GreaterThan,true,(duckdb::OrderType)3,duckdb::SpecializedGenericArgMinMaxState>,duckdb::string_t>
            (in_RDI,(LogicalType *)local_150);
  duckdb::LogicalType::~LogicalType((LogicalType *)local_150);
  AddGenericArgMinMaxFunction<duckdb::VectorArgMinMaxBase<duckdb::LessThan,true,(duckdb::OrderType)3,duckdb::GenericArgMinMaxState<(duckdb::OrderType)3>>>
            (in_RDI);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_280);
  duckdb::LogicalType::LogicalType((LogicalType *)local_150,ANY);
  duckdb::LogicalType::LogicalType((LogicalType *)(local_150 + 0x18),ANY);
  duckdb::LogicalType::LogicalType(local_120,BIGINT);
  __l._M_len = 3;
  __l._M_array = (iterator)local_150;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_298,__l,&local_2c9);
  duckdb::LogicalType::LogicalType(local_2c8,ANY);
  duckdb::LogicalType::LIST(local_2b0);
  AggregateFunction::AggregateFunction
            ((AggregateFunction *)local_280,(vector<duckdb::LogicalType,_true> *)&local_298,
             local_2b0,(aggregate_size_t)0x0,(aggregate_initialize_t)0x0,(aggregate_update_t)0x0,
             (aggregate_combine_t)0x0,(aggregate_finalize_t)0x0,(aggregate_simple_update_t)0x0,
             ArgMinMaxNBind<duckdb::GreaterThan>,(aggregate_destructor_t)0x0,
             (aggregate_statistics_t)0x0,(aggregate_window_t)0x0,(aggregate_serialize_t)0x0,
             (aggregate_deserialize_t)0x0);
  duckdb::LogicalType::~LogicalType(local_2b0);
  duckdb::LogicalType::~LogicalType(local_2c8);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_298);
  lVar3 = 0x30;
  do {
    duckdb::LogicalType::~LogicalType((LogicalType *)(local_150 + lVar3));
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  SimpleFunction::SimpleFunction((SimpleFunction *)local_150,(SimpleFunction *)local_280);
  local_150._0_8_ = duckdb::Value::DECIMAL;
  duckdb::LogicalType::LogicalType(local_c0,aLStack_1f0);
  local_c0[0x18] = aLStack_1f0[0x18];
  local_c0[0x19] = aLStack_1f0[0x19];
  local_c0[0x1a] = aLStack_1f0[0x1a];
  local_c0[0x1b] = aLStack_1f0[0x1b];
  local_150._0_8_ = &PTR__AggregateFunction_00890e90;
  puVar1 = auStack_1d0;
  puVar2 = auStack_a0;
  for (lVar3 = 0xd; lVar3 != 0; lVar3 = lVar3 + -1) {
    *puVar2 = *puVar1;
    puVar1 = puVar1 + (ulong)bVar4 * -2 + 1;
    puVar2 = puVar2 + (ulong)bVar4 * -2 + 1;
  }
  auStack_a0[0xd]._0_1_ = (AggregateOrderDependent)auStack_1d0[0xd];
  auStack_a0[0xd]._1_1_ = auStack_1d0[0xd]._1_1_;
  local_30 = local_160;
  local_28._M_pi = local_158._M_pi;
  if (local_158._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_158._M_pi)->_M_use_count = (local_158._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_158._M_pi)->_M_use_count = (local_158._M_pi)->_M_use_count + 1;
    }
  }
  std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>
            ((vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_> *)
             (in_RDI + 0x20),(AggregateFunction *)local_150);
  local_150._0_8_ = &PTR__AggregateFunction_00890e90;
  if (local_28._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28._M_pi);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_150);
  local_280._0_8_ = &PTR__AggregateFunction_00890e90;
  if (local_158._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_158._M_pi);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_280);
  return;
}

Assistant:

AggregateFunctionSet ArgMaxFun::GetFunctions() {
	AggregateFunctionSet fun;
	AddArgMinMaxFunctions<GreaterThan, true, OrderType::DESCENDING>(fun);
	AddArgMinMaxNFunction<GreaterThan>(fun);
	return fun;
}